

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeUnreachable(TranslateToFuzzReader *this,Type type)

{
  Expression *pEVar1;
  
  if (type.id == 1) {
    pEVar1 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x10,8);
    pEVar1->_id = UnreachableId;
    (pEVar1->type).id = 1;
    return pEVar1;
  }
  __assert_fail("type == Type::unreachable",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x111b,"Expression *wasm::TranslateToFuzzReader::makeUnreachable(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeUnreachable(Type type) {
  assert(type == Type::unreachable);
  return builder.makeUnreachable();
}